

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O2

void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *pNtk)

{
  int iVar1;
  uint numVars;
  Abc_Obj_t *pAVar2;
  DdManager *dd;
  Vec_Str_t *p;
  DdNode *n;
  char *pcVar3;
  int iVar4;
  
  if (pNtk->ntkFunc != ABC_FUNC_SOP) {
    __assert_fail("Abc_NtkHasSop(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcFunc.c"
                  ,0x223,"void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *)");
  }
  iVar4 = 0;
  do {
    if (pNtk->vObjs->nSize <= iVar4) {
      return;
    }
    pAVar2 = Abc_NtkObj(pNtk,iVar4);
    if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
      iVar1 = Abc_ObjIsBarBuf(pAVar2);
      if (iVar1 == 0) {
        iVar1 = Abc_SopIsComplement((char *)(pAVar2->field_5).pData);
        if (iVar1 != 0) {
          numVars = Abc_NtkGetFaninMax(pNtk);
          if (numVars == 0) {
            puts("Warning: The network has only constant nodes.");
          }
          iVar4 = 0;
          dd = Cudd_Init(numVars,0,0x100,0x40000,0);
          p = Vec_StrAlloc(numVars);
          do {
            if (pNtk->vObjs->nSize <= iVar4) {
              Vec_StrFree(p);
              Extra_StopManager(dd);
              return;
            }
            pAVar2 = Abc_NtkObj(pNtk,iVar4);
            if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
              iVar1 = Abc_ObjIsBarBuf(pAVar2);
              if (iVar1 == 0) {
                iVar1 = Abc_SopIsComplement((char *)(pAVar2->field_5).pData);
                if (iVar1 != 0) {
                  n = Abc_ConvertSopToBdd(dd,(char *)(pAVar2->field_5).pData,(DdNode **)0x0);
                  Cudd_Ref(n);
                  pcVar3 = Abc_ConvertBddToSop((Mem_Flex_t *)pNtk->pManFunc,dd,n,n,
                                               (pAVar2->vFanins).nSize,0,p,1);
                  (pAVar2->field_5).pData = pcVar3;
                  Cudd_RecursiveDeref(dd,n);
                  iVar1 = Abc_SopIsComplement((char *)(pAVar2->field_5).pData);
                  if (iVar1 != 0) {
                    __assert_fail("!Abc_SopIsComplement((char *)pNode->pData)",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcFunc.c"
                                  ,0x23e,"void Abc_NtkLogicMakeDirectSops(Abc_Ntk_t *)");
                  }
                }
              }
            }
            iVar4 = iVar4 + 1;
          } while( true );
        }
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void Abc_NtkLogicMakeDirectSops( Abc_Ntk_t * pNtk )
{
    DdManager * dd;
    DdNode * bFunc;
    Vec_Str_t * vCube;
    Abc_Obj_t * pNode;
    int nFaninsMax, fFound, i;

    assert( Abc_NtkHasSop(pNtk) );

    // check if there are nodes with complemented SOPs
    fFound = 0;
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Abc_ObjIsBarBuf(pNode) && Abc_SopIsComplement((char *)pNode->pData) )
        {
            fFound = 1;
            break;
        }
    if ( !fFound )
        return;

    // start the BDD package
    nFaninsMax = Abc_NtkGetFaninMax( pNtk );
    if ( nFaninsMax == 0 )
        printf( "Warning: The network has only constant nodes.\n" );
    dd = Cudd_Init( nFaninsMax, 0, CUDD_UNIQUE_SLOTS, CUDD_CACHE_SLOTS, 0 );

    // change the cover of negated nodes
    vCube = Vec_StrAlloc( 100 );
    Abc_NtkForEachNode( pNtk, pNode, i )
        if ( !Abc_ObjIsBarBuf(pNode) && Abc_SopIsComplement((char *)pNode->pData) )
        {
            bFunc = Abc_ConvertSopToBdd( dd, (char *)pNode->pData, NULL );  Cudd_Ref( bFunc );
            pNode->pData = Abc_ConvertBddToSop( (Mem_Flex_t *)pNtk->pManFunc, dd, bFunc, bFunc, Abc_ObjFaninNum(pNode), 0, vCube, 1 );
            Cudd_RecursiveDeref( dd, bFunc );
            assert( !Abc_SopIsComplement((char *)pNode->pData) );
        }
    Vec_StrFree( vCube );
    Extra_StopManager( dd );
}